

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

bool Image_Function::IsEqual
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,uint32_t width,uint32_t height)

{
  uint uVar1;
  byte bVar2;
  EVP_PKEY_CTX *src;
  uchar *puVar3;
  uchar *puVar4;
  ulong uVar5;
  undefined4 in_register_0000008c;
  uchar *puVar6;
  uint local_68;
  uint local_64;
  undefined8 local_60;
  ImageTemplate<unsigned_char> local_58;
  
  local_60 = CONCAT44(in_register_0000008c,startY2);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,width,height);
  bVar2 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in1,in2);
  local_64 = (uint)bVar2;
  local_68 = width * local_64;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00124c30;
  local_58._data = (uchar *)0x0;
  local_58._type = in2->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_68,&height,in1,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00124c30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar1 = in1->_rowSize;
  if (height * uVar1 != 0) {
    puVar6 = in1->_data + (ulong)(startX1 * local_64) + (ulong)(startY1 * uVar1);
    puVar3 = puVar6 + height * uVar1;
    puVar4 = in2->_data + (ulong)(startX2 * local_64) + (ulong)((int)local_60 * in2->_rowSize);
    do {
      if ((ulong)local_68 != 0) {
        uVar5 = 0;
        do {
          if (puVar6[uVar5] != puVar4[uVar5]) {
            return false;
          }
          uVar5 = uVar5 + 1;
        } while (local_68 != uVar5);
      }
      puVar6 = puVar6 + uVar1;
      puVar4 = puVar4 + in2->_rowSize;
    } while (puVar6 != puVar3);
  }
  return true;
}

Assistant:

bool IsEqual( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                  uint32_t width, uint32_t height )
    {
        ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, width, height );

        const uint8_t colorCount = CommonColorCount( in1, in2 );
        width = width * colorCount;

        OptimiseRoi( width, height, in1, in2 );

        const uint32_t rowSize1  = in1.rowSize();
        const uint32_t rowSize2  = in2.rowSize();

        const uint8_t * in1Y = in1.data() + startY1 * rowSize1 + startX1 * colorCount;
        const uint8_t * in2Y = in2.data() + startY2 * rowSize2 + startX2 * colorCount;

        const uint8_t * in1YEnd = in1Y + height * rowSize1;

        for( ; in1Y != in1YEnd; in1Y += rowSize1, in2Y += rowSize2 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            const uint8_t * in1XEnd = in1X + width;

            for( ; in1X != in1XEnd; ++in1X, ++in2X ) {
                if( (*in1X) != (*in2X) )
                    return false;
            }
        }

        return true;
    }